

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O0

int Cgt_ClockGatingRange(Cgt_Man_t *p,int iStart)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  abctime aVar9;
  abctime aVar10;
  Aig_Man_t *pAVar11;
  Cnf_Dat_t *pCVar12;
  sat_solver *psVar13;
  Vec_Ptr_t *pVVar14;
  abctime aVar15;
  int *pnOutputs;
  undefined4 uVar16;
  int nCallsFiltered;
  int nCallsUndec;
  int nCallsSat;
  int nCallsUnsat;
  abctime clkTotal;
  abctime clk;
  int local_18;
  int iStop;
  int nOutputs;
  int iStart_local;
  Cgt_Man_t *p_local;
  
  iStop = iStart;
  _nOutputs = p;
  aVar9 = Abc_Clock();
  iVar1 = _nOutputs->nCallsUnsat;
  iVar2 = _nOutputs->nCallsSat;
  iVar3 = _nOutputs->nCallsUndec;
  iVar4 = _nOutputs->nCallsFiltered;
  aVar10 = Abc_Clock();
  pnOutputs = &local_18;
  pAVar11 = Cgt_ManDupPartition(_nOutputs->pFrame,_nOutputs->pPars->nVarsMin,
                                _nOutputs->pPars->nFlopsMin,iStop,_nOutputs->pCare,
                                _nOutputs->vSuppsInv,pnOutputs);
  uVar16 = (undefined4)((ulong)pnOutputs >> 0x20);
  _nOutputs->pPart = pAVar11;
  pCVar12 = Cnf_DeriveSimple(_nOutputs->pPart,local_18);
  _nOutputs->pCnf = pCVar12;
  psVar13 = (sat_solver *)Cnf_DataWriteIntoSolver(_nOutputs->pCnf,1,0);
  _nOutputs->pSat = psVar13;
  sat_solver_compress(_nOutputs->pSat);
  iVar5 = Aig_ManObjNumMax(_nOutputs->pPart);
  pVVar14 = Vec_PtrAllocSimInfo(iVar5,_nOutputs->nPattWords);
  _nOutputs->vPatts = pVVar14;
  Vec_PtrCleanSimInfo(_nOutputs->vPatts,0,_nOutputs->nPattWords);
  aVar15 = Abc_Clock();
  _nOutputs->timePrepare = (aVar15 - aVar10) + _nOutputs->timePrepare;
  Cgt_ClockGatingRangeCheck(_nOutputs,iStop,local_18);
  iVar5 = iStop;
  iVar6 = iStop + local_18;
  if (_nOutputs->pPars->fVeryVerbose != 0) {
    uVar7 = iVar6 - iStop;
    iVar8 = Aig_ManCoNum(_nOutputs->pPart);
    printf("%5d : D =%4d. C =%5d. Var =%6d. Pr =%5d. Cex =%5d. F =%4d. Saved =%6d. ",
           (ulong)(uint)iVar5,(ulong)uVar7,(ulong)(uint)(iVar8 - local_18),
           (ulong)(uint)_nOutputs->pSat->size,(ulong)(uint)(_nOutputs->nCallsUnsat - iVar1),
           CONCAT44(uVar16,_nOutputs->nCallsSat - iVar2),_nOutputs->nCallsUndec - iVar3,
           _nOutputs->nCallsFiltered - iVar4);
    Abc_Print(1,"%s =","Time");
    aVar10 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar9) * 1.0) / 1000000.0);
  }
  Cgt_ManClean(_nOutputs);
  _nOutputs->nRecycles = _nOutputs->nRecycles + 1;
  return iVar6;
}

Assistant:

int Cgt_ClockGatingRange( Cgt_Man_t * p, int iStart )
{
    int nOutputs, iStop;
    abctime clk, clkTotal = Abc_Clock();
    int nCallsUnsat    = p->nCallsUnsat;
    int nCallsSat      = p->nCallsSat;
    int nCallsUndec    = p->nCallsUndec;
    int nCallsFiltered = p->nCallsFiltered;
clk = Abc_Clock();
    p->pPart = Cgt_ManDupPartition( p->pFrame, p->pPars->nVarsMin, p->pPars->nFlopsMin, iStart, p->pCare, p->vSuppsInv, &nOutputs );
    p->pCnf  = Cnf_DeriveSimple( p->pPart, nOutputs );
    p->pSat  = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
    sat_solver_compress( p->pSat );
    p->vPatts = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pPart), p->nPattWords );
    Vec_PtrCleanSimInfo( p->vPatts, 0, p->nPattWords );
p->timePrepare += Abc_Clock() - clk;
    Cgt_ClockGatingRangeCheck( p, iStart, nOutputs );
    iStop = iStart + nOutputs;
    if ( p->pPars->fVeryVerbose )
    {
        printf( "%5d : D =%4d. C =%5d. Var =%6d. Pr =%5d. Cex =%5d. F =%4d. Saved =%6d. ",
            iStart, iStop-iStart, Aig_ManCoNum(p->pPart)-nOutputs, p->pSat->size, 
            p->nCallsUnsat-nCallsUnsat, 
            p->nCallsSat  -nCallsSat, 
            p->nCallsUndec-nCallsUndec,
            p->nCallsFiltered-nCallsFiltered );
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    Cgt_ManClean( p );
    p->nRecycles++;
    return iStop;
}